

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::operator*(mat4 *a,mat4 *b)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  mat4 *in_RDI;
  
  fVar2 = b->m[1].x;
  fVar3 = b->m[2].x;
  fVar4 = b->m[3].x;
  fVar5 = b->m[0].x;
  fVar6 = b->m[0].y;
  fVar7 = b->m[1].y;
  fVar8 = b->m[2].y;
  fVar9 = b->m[0].z;
  fVar10 = b->m[0].w;
  fVar11 = b->m[1].z;
  fVar12 = b->m[1].w;
  fVar13 = b->m[2].z;
  fVar14 = b->m[2].w;
  fVar15 = b->m[3].y;
  fVar16 = b->m[3].z;
  fVar17 = b->m[3].w;
  in_RDI->m[0].x = 1.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  *(undefined8 *)&in_RDI->m[0].w = 0;
  in_RDI->m[1].y = 1.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 1.0;
  *(undefined8 *)&in_RDI->m[2].w = 0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 1.0;
  lVar22 = 0;
  do {
    fVar18 = *(float *)((long)&a->m[0].x + lVar22);
    fVar19 = *(float *)((long)&a->m[0].y + lVar22);
    fVar20 = *(float *)((long)&a->m[0].z + lVar22);
    fVar21 = *(float *)((long)&a->m[0].w + lVar22);
    pfVar1 = (float *)((long)&in_RDI->m[0].x + lVar22);
    *pfVar1 = fVar21 * fVar4 + fVar20 * fVar3 + fVar18 * fVar5 + fVar19 * fVar2;
    pfVar1[1] = fVar21 * fVar15 + fVar20 * fVar8 + fVar18 * fVar6 + fVar19 * fVar7;
    pfVar1[2] = fVar21 * fVar16 + fVar20 * fVar13 + fVar18 * fVar9 + fVar19 * fVar11;
    pfVar1[3] = fVar21 * fVar17 + fVar20 * fVar14 + fVar18 * fVar10 + fVar19 * fVar12;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  return in_RDI;
}

Assistant:

mat4 operator*(const mat4& a, const mat4& b)
{
    mat4 t = transpose(b), r;

    for (int j = 0; j < 4; ++j)
    for (int i = 0; i < 4; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}